

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

Test * __thiscall
testing::internal::TestFactoryImpl<AssertionTest_assertEqHandlerShouldBeCalled_Test>::CreateTest
          (TestFactoryImpl<AssertionTest_assertEqHandlerShouldBeCalled_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x38);
  Test::Test(this_00);
  *(undefined4 *)&this_00[1]._vptr_Test = 0;
  this_00[1].gtest_flag_saver_ = (GTestFlagSaver *)&this_00[2].gtest_flag_saver_;
  this_00[2]._vptr_Test = (_func_int **)0x0;
  *(undefined1 *)&this_00[2].gtest_flag_saver_ = 0;
  this_00->_vptr_Test = (_func_int **)&PTR__AssertionTest_001790d8;
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }